

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindVertexBuffersTest::iterate(FunctionalBindVertexBuffersTest *this)

{
  pointer *this_00;
  pointer *this_01;
  GLuint GVar1;
  code *pcVar2;
  Context *pCVar3;
  GLenum index;
  GLint GVar4;
  value_type vVar5;
  char cVar6;
  int iVar7;
  deUint32 dVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  TestContext *pTVar15;
  TestLog *this_02;
  MessageBuilder *pMVar16;
  TestError *this_03;
  Enum<int,_2UL> EVar17;
  exception *anon_var_0;
  GLint i_5;
  Enum<int,_2UL> local_280;
  GetNameFunc local_270;
  int local_268;
  Enum<int,_2UL> local_260;
  int local_24c;
  MessageBuilder local_248;
  int local_c4;
  GLuint local_c0;
  GLenum generated_error;
  GLint i_4;
  GLint i_3;
  GLint i_2;
  GLint half_index;
  GLint i_1;
  GLuint vao;
  GLint i;
  undefined1 local_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_buffer_ids;
  vector<int,_std::allocator<int>_> strides;
  vector<long,_std::allocator<long>_> offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_ids;
  vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> buffer;
  GLint max_buffers;
  GLuint invalid_id;
  Functions *gl;
  FunctionalBindVertexBuffersTest *this_local;
  long lVar10;
  
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  (**(code **)(lVar10 + 0x868))
            (0x82da,&buffer.
                     super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xca9);
  this_00 = &buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::vector
            ((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> *)
             this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::resize
            ((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> *)
             this_00,(long)(int)buffer.
                                super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (long)(int)buffer.
                        super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::resize
            ((vector<long,_std::allocator<long>_> *)
             &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (long)(int)buffer.
                        super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             &t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (long)(int)buffer.
                        super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,
             (long)(int)buffer.
                        super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (i_1 = 0; i_1 < (int)buffer.
                           super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage; i_1 = i_1 + 1) {
    pvVar11 = std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::
              operator[]((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                          *)&buffer_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(long)i_1);
    MultiBind::Buffer::InitData
              (pvVar11,(this->super_TestCase).m_context,0x8892,0x88ea,0x10,(GLvoid *)0x0);
    pvVar11 = std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::
              operator[]((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                          *)&buffer_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(long)i_1);
    GVar1 = pvVar11->m_id;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)i_1);
    *pvVar12 = GVar1;
    pvVar13 = std::vector<long,_std::allocator<long>_>::operator[]
                        ((vector<long,_std::allocator<long>_> *)
                         &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)i_1);
    *pvVar13 = 4;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &t_buffer_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)i_1);
    *pvVar14 = 4;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,(long)i_1);
    *pvVar12 = 0;
  }
  half_index = 0;
  (**(code **)(lVar10 + 0x708))(1,&half_index);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcc5);
  (**(code **)(lVar10 + 0xd8))(half_index);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"BindVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcc9);
  iVar7 = (int)buffer.
               super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar2 = *(code **)(lVar10 + 0xe8);
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  pvVar13 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)
                       &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  (*pcVar2)(0,iVar7,pvVar12,pvVar13,pvVar14);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xccf);
  for (i_2 = 0; GVar4 = i_2,
      i_2 < (int)buffer.
                 super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage; i_2 = i_2 + 1) {
    pCVar3 = (this->super_TestCase).m_context;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)i_2);
    checkVertexAttribBinding(pCVar3,GVar4,*pvVar12);
  }
  iVar7 = (int)buffer.
               super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage / 2;
  pcVar2 = *(code **)(lVar10 + 0xe8);
  i_3 = iVar7;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,0);
  pvVar13 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)
                       &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  (*pcVar2)(0,iVar7,pvVar12,pvVar13,pvVar14);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcdd);
  for (i_4 = 0; i_4 < i_3; i_4 = i_4 + 1) {
    checkVertexAttribBinding((this->super_TestCase).m_context,i_4,0);
  }
  for (generated_error = i_3; GVar4 = i_3, index = generated_error,
      (int)generated_error <
      (int)buffer.
           super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage; generated_error = generated_error + 1
      ) {
    pCVar3 = (this->super_TestCase).m_context;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)(int)generated_error);
    checkVertexAttribBinding(pCVar3,index,*pvVar12);
  }
  pcVar2 = *(code **)(lVar10 + 0xe8);
  iVar7 = (int)buffer.
               super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage - i_3;
  pvVar13 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)
                       &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  (*pcVar2)(GVar4,iVar7,0,pvVar13,pvVar14);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"BindVertexBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xcee);
  for (local_c0 = 0;
      (int)local_c0 <
      (int)buffer.
           super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage; local_c0 = local_c0 + 1) {
    checkVertexAttribBinding((this->super_TestCase).m_context,local_c0,0);
  }
  while (cVar6 = (**(code **)(lVar10 + 0xc68))
                           (buffer.
                            super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_),
        vVar5 = buffer.
                super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_, cVar6 == '\x01') {
    buffer.super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         buffer.
         super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  this_01 = &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,0);
  iVar7 = (int)buffer.
               super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *pvVar12 = vVar5;
  pcVar2 = *(code **)(lVar10 + 0xe8);
  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,0);
  pvVar13 = std::vector<long,_std::allocator<long>_>::operator[]
                      ((vector<long,_std::allocator<long>_> *)
                       &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  (*pcVar2)(0,iVar7,pvVar12,pvVar13,pvVar14);
  local_c4 = (**(code **)(lVar10 + 0x800))();
  if (local_c4 == 0x502) {
    checkVertexAttribBinding((this->super_TestCase).m_context,0,0);
    for (anon_var_0._4_4_ = 1;
        iVar7 = (int)buffer.
                     super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
        (int)anon_var_0._4_4_ <
        (int)buffer.
             super__Vector_base<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        anon_var_0._4_4_ = anon_var_0._4_4_ + 1) {
      pCVar3 = (this->super_TestCase).m_context;
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)(int)anon_var_0._4_4_);
      checkVertexAttribBinding(pCVar3,anon_var_0._4_4_,*pvVar12);
    }
    pcVar2 = *(code **)(lVar10 + 0xe8);
    pvVar13 = std::vector<long,_std::allocator<long>_>::operator[]
                        ((vector<long,_std::allocator<long>_> *)
                         &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &t_buffer_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    (*pcVar2)(0,iVar7,0,pvVar13,pvVar14);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"BindVertexBuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xd12);
    (**(code **)(lVar10 + 0x490))(1,&half_index);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"DeleteVertexArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xd1c);
    pTVar15 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar15,QP_TEST_RESULT_PASS,"Pass");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &t_buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               &strides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_>::~vector
              ((vector<gl4cts::MultiBind::Buffer,_std::allocator<gl4cts::MultiBind::Buffer>_> *)
               &buffer_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return STOP;
  }
  pTVar15 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_02 = tcu::TestContext::getLog(pTVar15);
  tcu::TestLog::operator<<(&local_248,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar16 = tcu::MessageBuilder::operator<<(&local_248,(char (*) [7])0x2a28b75);
  pMVar16 = tcu::MessageBuilder::operator<<
                      (pMVar16,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      );
  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [9])", line: ");
  local_24c = 0xd08;
  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_24c);
  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [20])". Got wrong error: ");
  EVar17 = glu::getErrorStr(local_c4);
  local_270 = EVar17.m_getName;
  local_268 = EVar17.m_value;
  local_260.m_getName = local_270;
  local_260.m_value = local_268;
  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_260);
  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [13])0x2a14159);
  EVar17 = glu::getErrorStr(0x502);
  local_280.m_getName = EVar17.m_getName;
  local_280.m_value = EVar17.m_value;
  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_280);
  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [12])", message: ");
  pMVar16 = tcu::MessageBuilder::operator<<
                      (pMVar16,(char (*) [34])"BindVertexBuffers with invalid id");
  tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_248);
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_03,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0xd08);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindVertexBuffersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	static const GLintptr buffer_size = 16;
	static const GLintptr offset	  = 4;
	static const GLsizei  stride	  = 4;

	GLuint invalid_id  = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_buffers = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &max_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	std::vector<Buffer>   buffer;
	std::vector<GLuint>   buffer_ids;
	std::vector<GLintptr> offsets;
	std::vector<GLsizei>  strides;
	std::vector<GLuint>   t_buffer_ids;

	buffer.resize(max_buffers);
	buffer_ids.resize(max_buffers);
	offsets.resize(max_buffers);
	strides.resize(max_buffers);
	t_buffer_ids.resize(max_buffers);

	/* Prepare buffers */
	for (GLint i = 0; i < max_buffers; ++i)
	{
		buffer[i].InitData(m_context, GL_ARRAY_BUFFER, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

		buffer_ids[i]   = buffer[i].m_id;
		offsets[i]		= offset;
		strides[i]		= stride;
		t_buffer_ids[i] = 0;
	}

	GLuint vao = 0;
	gl.genVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");
	try
	{
		gl.bindVertexArray(vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArrays");

		/* - execute BindVertexBuffers to bind all buffer;
		 * - inspect bindings to verify that proper buffers were set;
		 */
		gl.bindVertexBuffers(0, max_buffers, &buffer_ids[0], &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - execute BindVertexBuffers for first half of bindings with <buffers> filled
		 * with zeros, to unbind those buffers;
		 * - inspect bindings to verify that proper buffers were unbound;
		 */
		GLint half_index = max_buffers / 2;

		gl.bindVertexBuffers(0, half_index, &t_buffer_ids[0], &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < half_index; ++i)
		{
			checkVertexAttribBinding(m_context, i, 0);
		}

		for (GLint i = half_index; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - execute BindVertexBuffers for second half of bindings with NULL as
		 * <buffers>, to unbind those buffers;
		 * - inspect bindings to verify that proper buffers were unbound;
		 */
		gl.bindVertexBuffers(half_index, max_buffers - half_index, 0, &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");

		for (GLint i = 0; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, 0);
		}

		/* - modify <buffers> so first entry is invalid;
		 * - execute BindVertexBuffers to bind all buffers; It is expected that
		 * INVALID_OPERATION will be generated;
		 * - inspect bindings to verify that proper buffers were set;
		 */

		/* Find invalid id */
		while (1)
		{
			if (GL_TRUE != gl.isBuffer(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		buffer_ids[0] = invalid_id;
		gl.bindVertexBuffers(0, max_buffers, &buffer_ids[0], &offsets[0], &strides[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindVertexBuffers with invalid id");

		checkVertexAttribBinding(m_context, 0, 0);
		for (GLint i = 1; i < max_buffers; ++i)
		{
			checkVertexAttribBinding(m_context, i, buffer_ids[i]);
		}

		/* - unbind all buffers. */
		gl.bindVertexBuffers(0, max_buffers, 0, &offsets[0], &strides[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexBuffers");
	}
	catch (const std::exception&)
	{
		gl.deleteVertexArrays(1, &vao);

		TCU_FAIL("Unexpected error generated");
	}

	gl.deleteVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DeleteVertexArrays");

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}